

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O1

void booke206_update_mas_tlb_miss
               (CPUPPCState_conflict2 *env,target_ulong address,int rw,int mmu_idx)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar5 = mmu_idx & 0xfffffffe;
  if (uVar5 == 8) {
    uVar7 = (uint)env->spr[(ulong)(mmu_idx == 9) + 0x3b3];
    mmu_idx = uVar7 & 0xff;
    uVar7 = uVar7 >> 0x1e;
  }
  else {
    uVar7 = (uint)(byte)((byte)env->msr >> 4);
  }
  if (rw == 2) {
    uVar7 = (uint)(byte)((byte)env->msr >> 5);
  }
  uVar6 = (uint)env->spr[0x274];
  env->spr[0x270] = (ulong)(uVar6 & 0x30000000);
  env->spr[0x271] = (ulong)(uVar6 & 0xf80);
  env->spr[0x272] = (ulong)(uVar6 & 0x1f);
  env->spr[0x273] = 0;
  env->spr[0x276] = 0;
  env->spr[0x3b0] = 0;
  if ((uVar7 & 1) != 0) {
    env->spr[0x271] = (ulong)(uVar6 & 0xf80) | 0x1000;
    env->spr[0x276] = 1;
  }
  uVar3 = env->spr[0x271] | 0x80000000;
  env->spr[0x271] = uVar3;
  env->spr[0x272] = (ulong)(uVar6 & 0x1f) | address & 0xfffffffffffff000;
  if (uVar5 == 8) {
    uVar4 = (ulong)(uint)(mmu_idx << 0x10);
    goto LAB_00b6d212;
  }
  switch(uVar6 >> 0x10 & 3) {
  case 0:
    lVar2 = 0xc98;
    break;
  case 1:
    lVar2 = 0x1ee0;
    break;
  case 2:
    lVar2 = 0x1ee8;
    break;
  case 3:
    mmu_idx = 0;
    goto LAB_00b6d207;
  }
  mmu_idx = *(uint *)((long)env->gpr + lVar2);
LAB_00b6d207:
  uVar4 = env->spr[0x30] << 0x10;
LAB_00b6d212:
  env->spr[0x276] = env->spr[0x276] | uVar4;
  env->spr[0x271] = uVar3 | (uint)(mmu_idx << 0x10);
  iVar1 = env->last_way;
  uVar5 = *(byte *)((long)env->spr + 0x1583) - 1 & iVar1 + 1U;
  env->last_way = uVar5;
  env->spr[0x270] = (long)(int)uVar5 | (ulong)(uVar6 & 0x30000000) | (long)(iVar1 << 0x10);
  return;
}

Assistant:

static void booke206_update_mas_tlb_miss(CPUPPCState *env, target_ulong address,
                                     int rw, int mmu_idx)
{
    uint32_t epid;
    bool as, pr;
    uint32_t missed_tid = 0;
    bool use_epid = mmubooke206_get_as(env, mmu_idx, &epid, &as, &pr);
    if (rw == 2) {
        as = msr_ir;
    }
    env->spr[SPR_BOOKE_MAS0] = env->spr[SPR_BOOKE_MAS4] & MAS4_TLBSELD_MASK;
    env->spr[SPR_BOOKE_MAS1] = env->spr[SPR_BOOKE_MAS4] & MAS4_TSIZED_MASK;
    env->spr[SPR_BOOKE_MAS2] = env->spr[SPR_BOOKE_MAS4] & MAS4_WIMGED_MASK;
    env->spr[SPR_BOOKE_MAS3] = 0;
    env->spr[SPR_BOOKE_MAS6] = 0;
    env->spr[SPR_BOOKE_MAS7] = 0;

    /* AS */
    if (as) {
        env->spr[SPR_BOOKE_MAS1] |= MAS1_TS;
        env->spr[SPR_BOOKE_MAS6] |= MAS6_SAS;
    }

    env->spr[SPR_BOOKE_MAS1] |= MAS1_VALID;
    env->spr[SPR_BOOKE_MAS2] |= address & MAS2_EPN_MASK;

    if (!use_epid) {
        switch (env->spr[SPR_BOOKE_MAS4] & MAS4_TIDSELD_PIDZ) {
        case MAS4_TIDSELD_PID0:
            missed_tid = env->spr[SPR_BOOKE_PID];
            break;
        case MAS4_TIDSELD_PID1:
            missed_tid = env->spr[SPR_BOOKE_PID1];
            break;
        case MAS4_TIDSELD_PID2:
            missed_tid = env->spr[SPR_BOOKE_PID2];
            break;
        }
        env->spr[SPR_BOOKE_MAS6] |= env->spr[SPR_BOOKE_PID] << 16;
    } else {
        missed_tid = epid;
        env->spr[SPR_BOOKE_MAS6] |= missed_tid << 16;
    }
    env->spr[SPR_BOOKE_MAS1] |= (missed_tid << MAS1_TID_SHIFT);


    /* next victim logic */
    env->spr[SPR_BOOKE_MAS0] |= env->last_way << MAS0_ESEL_SHIFT;
    env->last_way++;
    env->last_way &= booke206_tlb_ways(env, 0) - 1;
    env->spr[SPR_BOOKE_MAS0] |= env->last_way << MAS0_NV_SHIFT;
}